

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O0

void __thiscall
HalosExchange::sendrecv(HalosExchange *this,int i,MPI_Request *send_rq,MPI_Request *recv_rq,int tag)

{
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  
  MPI_Irecv(*(undefined8 *)(*(long *)(in_RDI + 0x28) + (long)in_ESI * 8),
            *(undefined4 *)(in_RDI + 0x30),&ompi_mpi_double,
            *(undefined4 *)(*(long *)(in_RDI + 0x10) + (long)in_ESI * 4),in_R8D,&ompi_mpi_comm_world
           );
  MPI_Isend(*(undefined8 *)(in_RDI + 0x20),*(undefined4 *)(in_RDI + 0x30),&ompi_mpi_double,
            *(undefined4 *)(*(long *)(in_RDI + 0x10) + (long)in_ESI * 4),in_R8D,&ompi_mpi_comm_world
            ,in_RDX);
  return;
}

Assistant:

virtual void sendrecv(int i, MPI_Request* send_rq, MPI_Request* recv_rq,
                          int tag)
    {
        MPI_Irecv(rbuf[i], n_elements, MPI_DOUBLE, partners[i], tag,
                  MPI_COMM_WORLD, recv_rq);
        MPI_Isend(sbuf, n_elements, MPI_DOUBLE, partners[i], tag,
                  MPI_COMM_WORLD, send_rq);
    }